

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O2

int opcode_dec(pt_ild *ild,uint8_t length)

{
  uint8_t uVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  
  uVar1 = ild->itext[CONCAT71(in_register_00000031,length) & 0xffffffff];
  if (uVar1 != '\x0f') {
    ild->map = '\0';
    ild->nominal_opcode = uVar1;
    cVar3 = '\x01';
LAB_00109519:
    iVar4 = modrm_dec(ild,length + cVar3);
    return iVar4;
  }
  uVar5 = (int)CONCAT71(in_register_00000031,length) + 1;
  if (ild->max_bytes <= (byte)uVar5) {
    return -0xe;
  }
  bVar2 = ild->itext[uVar5 & 0xff];
  if (bVar2 == 0x3a) {
    ild->map = '\x03';
    ild->imm1_bytes = '\x01';
  }
  else if (bVar2 == 0x38) {
    ild->map = '\x02';
  }
  else {
    if ((bVar2 & 0xf8) != 0x38) {
      ild->nominal_opcode = bVar2;
      ild->map = '\x01';
      cVar3 = '\x02';
      goto LAB_00109519;
    }
    ild->map = '\b';
  }
  iVar4 = get_next_as_opcode(ild,length + '\x02');
  return iVar4;
}

Assistant:

static int opcode_dec(struct pt_ild *ild, uint8_t length)
{
	uint8_t b, m;

	if (!ild)
		return -pte_internal;

	/*no need to check max_bytes - it was checked in previous scanners */
	b = get_byte(ild, length);
	if (b != 0x0F) {	/* 1B opcodes, map 0 */
		ild->map = PTI_MAP_0;
		ild->nominal_opcode = b;

		return modrm_dec(ild, length + 1);
	}

	length++;		/* eat the 0x0F */

	if (ild->max_bytes <= length)
		return -pte_bad_insn;

	/* 0x0F opcodes MAPS 1,2,3 */
	m = get_byte(ild, length);
	if (m == 0x38) {
		ild->map = PTI_MAP_2;

		return get_next_as_opcode(ild, length + 1);
	} else if (m == 0x3A) {
		ild->map = PTI_MAP_3;
		ild->imm1_bytes = 1;

		return get_next_as_opcode(ild, length + 1);
	} else if (bits_match(m, 0xf8, 0x38)) {
		ild->map = PTI_MAP_INVALID;

		return get_next_as_opcode(ild, length + 1);
	} else {	/* map 1 (simple two byte opcodes) */
		ild->nominal_opcode = m;
		ild->map = PTI_MAP_1;

		return modrm_dec(ild, length + 1);
	}
}